

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.cpp
# Opt level: O0

bool __thiscall CMU462::Timeline::unmarkTime(Timeline *this,int time)

{
  bool bVar1;
  set<int,_std::less<int>,_std::allocator<int>_> *in_RDI;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffffc8;
  _Self in_stack_ffffffffffffffd8;
  _Self local_20 [4];
  
  local_20[0]._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::find
                 (in_stack_ffffffffffffffd8._M_node,(key_type *)in_RDI);
  std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_ffffffffffffffc8);
  bVar1 = std::operator!=(local_20,(_Self *)&stack0xffffffffffffffd8);
  if (bVar1) {
    std::set<int,_std::less<int>,_std::allocator<int>_>::erase
              (in_RDI,(key_type *)in_stack_ffffffffffffffc8);
  }
  return bVar1;
}

Assistant:

bool Timeline::unmarkTime(int time) {
  if (times.find(time) != times.end()) {
    times.erase(time);
    return true;
  }

  return false;
}